

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::MthdCelsiusTexFilter::is_valid_val(MthdCelsiusTexFilter *this)

{
  uint uVar1;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (((uVar1 & 0xffe000) == 0) && (0xfffffffffffffff9 < (ulong)(uVar1 >> 0x18 & 0xf) - 7)) {
    return uVar1 + 0xf0000000 < 0x20000000;
  }
  return false;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 13, 11))
			return false;
		if (extr(val, 24, 4) < 1 || extr(val, 24, 4) > 6)
			return false;
		if (extr(val, 28, 4) < 1 || extr(val, 28, 4) > 2)
			return false;
		return true;
	}